

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

void __thiscall
CLOptions::PrintDescription(CLOptions *this,string *param_description,int left_padding)

{
  bool bVar1;
  long lVar2;
  reference pbVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  iterator word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  desc_words;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  CLOptionsHelper::split(&local_48,param_description,' ');
  __gnu_cxx::
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&local_50);
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&local_48);
  local_58._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&local_48);
  bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
  if (bVar1) {
    lVar5 = 0;
    do {
      if (lVar5 == 0) {
        iVar6 = left_padding;
        if (0 < left_padding) {
          do {
            std::operator<<((ostream *)&std::cout," ");
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar3);
        std::operator<<(poVar4," ");
LAB_00134981:
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_50);
        lVar5 = std::__cxx11::string::length();
        lVar5 = lVar5 + (long)left_padding + 1;
      }
      else {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_50);
        lVar2 = std::__cxx11::string::length();
        if (0x50 < (ulong)(lVar2 + lVar5)) {
          std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          iVar6 = left_padding;
          if (0 < left_padding) {
            do {
              std::operator<<((ostream *)&std::cout," ");
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          pbVar3 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_50);
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar3);
          std::operator<<(poVar4," ");
          goto LAB_00134981;
        }
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar3);
        std::operator<<(poVar4," ");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_50);
        lVar2 = std::__cxx11::string::length();
        lVar5 = lVar5 + lVar2 + 1;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
      local_58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&local_48);
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
    } while (bVar1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CLOptions::PrintDescription(const std::string& param_description, int left_padding)
{
    // Split the description into individual words
    std::vector<std::string> desc_words = CLOptionsHelper::split(param_description, ' ') ;
    std::vector<std::string>::iterator word ;
    
    size_t current_length(0) ;
    
    for (word=desc_words.begin(); word!=desc_words.end(); ++word) {
        // If there are no words on this line, print the next word
        if (current_length == 0) {
            for (int s=0; s<left_padding; s++) std::cout << " " ;
            std::cout << (*word) << " " ;
            current_length = left_padding + word->length() + 1 ;
        }
        // Else, if the next word would send us over the limit of the
        // line, print a new line and then print the word
        else if (current_length+word->length() > CLOPT_MAX_WIDTH) {
            std::cout << std::endl ;
            for (int s=0; s<left_padding; s++) std::cout << " " ;
            std::cout << (*word) << " " ;
            current_length = left_padding + word->length() + 1 ;
        }
        // Else, just print the word
        else {
            std::cout << (*word) << " " ;
            current_length += word->length() + 1 ;
        }
    }
    std::cout << std::endl;
}